

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_tree_file_check_max_bytes(mpack_tree_t *tree,size_t max_bytes)

{
  size_t max_bytes_local;
  mpack_tree_t *tree_local;
  
  if (max_bytes >= 0x8000000000000000) {
    mpack_tree_init_error(tree,mpack_error_bug);
  }
  return max_bytes < 0x8000000000000000;
}

Assistant:

static bool mpack_tree_file_check_max_bytes(mpack_tree_t* tree, size_t max_bytes) {

    // the C STDIO family of file functions use long (e.g. ftell)
    if (max_bytes > LONG_MAX) {
        mpack_break("max_bytes of %" PRIu64 " is invalid, maximum is LONG_MAX", (uint64_t)max_bytes);
        mpack_tree_init_error(tree, mpack_error_bug);
        return false;
    }

    return true;
}